

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall
cmCTestP4::IdentifyParser::IdentifyParser
          (IdentifyParser *this,cmCTestP4 *p4,char *prefix,string *rev)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__IdentifyParser_00a0bbb0;
  this->Rev = rev;
  (this->RegexIdentify).regmust = (char *)0x0;
  (this->RegexIdentify).program = (char *)0x0;
  (this->RegexIdentify).progsize = 0;
  memset(&this->RegexIdentify,0,0x20a);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(p4->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexIdentify,"^Change ([0-9]+) on");
  return;
}

Assistant:

IdentifyParser(cmCTestP4* p4, const char* prefix, std::string& rev)
    : Rev(rev)
  {
    this->SetLog(&p4->Log, prefix);
    this->RegexIdentify.compile("^Change ([0-9]+) on");
  }